

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error
adios2_inquire_group_variables
          (adios2_variable ***variables,char *full_prefix,size_t *size,adios2_io *io)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  adios2_variable **ppaVar4;
  const_iterator cVar5;
  Variable *pVVar6;
  _Base_ptr p_Var7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var8;
  adios2_variable **ppaVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"for adios2_io, in call to adios2_inquire_all_variables",
             (allocator *)&names);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)adios2::core::IO::GetVariables_abi_cxx11_();
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &names._M_t._M_impl.super__Rb_tree_header._M_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = strlen(full_prefix);
  p_Var8 = this + 0x10;
  while (p_Var8 = *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    **)p_Var8,
        p_Var8 != (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
    std::__cxx11::string::string((string *)&curr,(string *)(p_Var8 + 8));
    if (((sVar1 < curr._M_string_length) &&
        (lVar2 = std::__cxx11::string::find((char *)&curr,(ulong)full_prefix), lVar2 == 0)) &&
       (uVar3 = std::__cxx11::string::rfind((char *)&curr,0x128767), uVar3 <= sVar1)) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&names,&curr);
    }
    std::__cxx11::string::~string((string *)&curr);
  }
  *size = names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  ppaVar4 = (adios2_variable **)calloc(names._M_t._M_impl.super__Rb_tree_header._M_node_count,8);
  ppaVar9 = ppaVar4;
  p_Var7 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 == &names._M_t._M_impl.super__Rb_tree_header) {
      *variables = ppaVar4;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&names._M_t);
      return adios2_error_none;
    }
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this,(key_type *)(p_Var7 + 1));
    switch(*(undefined4 *)
            (*(long *)((long)cVar5.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
                             ._M_cur + 0x28) + 0x28)) {
    case 1:
      pVVar6 = adios2::core::IO::InquireVariable<signed_char>((string *)io);
      break;
    case 2:
      pVVar6 = adios2::core::IO::InquireVariable<short>((string *)io);
      break;
    case 3:
      pVVar6 = adios2::core::IO::InquireVariable<int>((string *)io);
      break;
    case 4:
      pVVar6 = adios2::core::IO::InquireVariable<long>((string *)io);
      break;
    case 5:
      pVVar6 = adios2::core::IO::InquireVariable<unsigned_char>((string *)io);
      break;
    case 6:
      pVVar6 = adios2::core::IO::InquireVariable<unsigned_short>((string *)io);
      break;
    case 7:
      pVVar6 = adios2::core::IO::InquireVariable<unsigned_int>((string *)io);
      break;
    case 8:
      pVVar6 = adios2::core::IO::InquireVariable<unsigned_long>((string *)io);
      break;
    case 9:
      pVVar6 = adios2::core::IO::InquireVariable<float>((string *)io);
      break;
    case 10:
      pVVar6 = adios2::core::IO::InquireVariable<double>((string *)io);
      break;
    case 0xb:
      pVVar6 = adios2::core::IO::InquireVariable<long_double>((string *)io);
      break;
    case 0xc:
      pVVar6 = adios2::core::IO::InquireVariable<std::complex<float>>((string *)io);
      break;
    case 0xd:
      pVVar6 = adios2::core::IO::InquireVariable<std::complex<double>>((string *)io);
      break;
    case 0xe:
      pVVar6 = adios2::core::IO::InquireVariable<std::__cxx11::string>((string *)io);
      break;
    case 0xf:
      pVVar6 = adios2::core::IO::InquireVariable<char>((string *)io);
      break;
    default:
      goto switchD_0011ad26_default;
    }
    *ppaVar9 = (adios2_variable *)pVVar6;
switchD_0011ad26_default:
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    ppaVar9 = ppaVar9 + 1;
  } while( true );
}

Assistant:

adios2_error adios2_inquire_group_variables(adios2_variable ***variables, const char *full_prefix,
                                            size_t *size, adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetVariables();

        // Sort the names so that we return the same order as the
        // C++, python APIs

        std::set<std::string> names;
        size_t prefix_size = strlen(full_prefix);
        for (auto &it : dataMap)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.rfind("/");
                if (pos <= prefix_size)
                {
                    names.insert(curr);
                }
            }
        }

        *size = names.size();
        adios2_variable **list = (adios2_variable **)calloc(*size, sizeof(adios2_variable *));

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::VariableBase *variable = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        variable = ioCpp.InquireVariable<T>(name);                                                 \
        list[n] = reinterpret_cast<adios2_variable *>(variable);                                   \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *variables = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}